

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int streamProcessTest(char *filename,char *result,char *err,xmlTextReaderPtr reader,char *rng,
                     int options)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  FILE *__stream;
  char *pcVar6;
  long lVar7;
  xmlTextReaderPtr pxVar8;
  char *local_60;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  nb_tests = nb_tests + 1;
  if (result == (char *)0x0) {
    local_60 = (char *)0x0;
    __stream = (FILE *)0x0;
  }
  else {
    local_60 = resultFilename(filename,temp_directory,".res");
    if (local_60 == (char *)0x0) {
      streamProcessTest_cold_2();
      iVar1 = xmlFreeEntity();
      return iVar1;
    }
    __stream = fopen64(local_60,"wb");
    if (__stream == (FILE *)0x0) {
      streamProcessTest_cold_1();
      return -1;
    }
  }
  if ((rng != (char *)0x0) &&
     (pxVar8 = reader, iVar1 = xmlTextReaderRelaxNGValidate(reader,rng), iVar1 < 0)) {
    testErrorHandler(pxVar8,"Relax-NG schema %s failed to compile\n",rng);
    fclose(__stream);
    if (local_60 != (char *)0x0) {
      unlink(local_60);
      free(local_60);
      return 0;
    }
    return 0;
  }
  pxVar8 = reader;
  iVar1 = xmlTextReaderRead();
  while (iVar1 == 1) {
    if (__stream != (FILE *)0x0 && rng == (char *)0x0) {
      uVar2 = xmlTextReaderNodeType(reader);
      uVar3 = xmlTextReaderIsEmptyElement(reader);
      pcVar6 = (char *)xmlTextReaderConstName(reader);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "--";
      }
      lVar7 = xmlTextReaderConstValue(reader);
      uVar4 = xmlTextReaderDepth(reader);
      uVar5 = xmlTextReaderHasValue(reader);
      fprintf(__stream,"%d %d %s %d %d",(ulong)uVar4,(ulong)uVar2,pcVar6,(ulong)uVar3,uVar5);
      if (lVar7 == 0) {
        fputc(10,__stream);
      }
      else {
        fprintf(__stream," %s\n",lVar7);
      }
    }
    pxVar8 = reader;
    iVar1 = xmlTextReaderRead();
  }
  if (iVar1 != 0) {
    testErrorHandler(pxVar8,"%s : failed to parse\n",filename);
  }
  if (rng != (char *)0x0) {
    iVar1 = xmlTextReaderIsValid();
    pcVar6 = "%s fails to validate\n";
    if (iVar1 == 1) {
      pcVar6 = "%s validates\n";
    }
    testErrorHandler(reader,pcVar6,filename);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    iVar1 = compareFiles(local_60,result);
    if (local_60 != (char *)0x0) {
      unlink(local_60);
      free(local_60);
    }
    if (iVar1 != 0) {
      fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
      return -1;
    }
  }
  if (err == (char *)0x0) {
    return 0;
  }
  iVar1 = compareFileMem(err,testErrors,testErrorsSize);
  if (iVar1 != 0) {
    streamProcessTest_cold_3();
    return -1;
  }
  return 0;
}

Assistant:

static int
streamProcessTest(const char *filename, const char *result, const char *err,
                  xmlTextReaderPtr reader, const char *rng,
                  int options ATTRIBUTE_UNUSED) {
    int ret;
    char *temp = NULL;
    FILE *t = NULL;

    if (reader == NULL)
        return(-1);

    nb_tests++;
    if (result != NULL) {
	temp = resultFilename(filename, temp_directory, ".res");
	if (temp == NULL) {
	    fprintf(stderr, "Out of memory\n");
	    fatalError();
	}
	t = fopen(temp, "wb");
	if (t == NULL) {
	    fprintf(stderr, "Can't open temp file %s\n", temp);
	    free(temp);
	    return(-1);
	}
    }
#ifdef LIBXML_SCHEMAS_ENABLED
    if (rng != NULL) {
	ret = xmlTextReaderRelaxNGValidate(reader, rng);
	if (ret < 0) {
	    testErrorHandler(NULL, "Relax-NG schema %s failed to compile\n",
	                     rng);
	    fclose(t);
            if (temp != NULL) {
                unlink(temp);
                free(temp);
            }
	    return(0);
	}
    }
#endif
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
	if ((t != NULL) && (rng == NULL))
	    processNode(t, reader);
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        testErrorHandler(NULL, "%s : failed to parse\n", filename);
    }
    if (rng != NULL) {
        if (xmlTextReaderIsValid(reader) != 1) {
	    testErrorHandler(NULL, "%s fails to validate\n", filename);
	} else {
	    testErrorHandler(NULL, "%s validates\n", filename);
	}
    }
    if (t != NULL) {
        fclose(t);
	ret = compareFiles(temp, result);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    return(-1);
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    printf("%s", testErrors);
	    return(-1);
	}
    }

    return(0);
}